

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void luaK_exp2nextreg(FuncState *fs,expdesc *e)

{
  FuncState *in_RSI;
  expdesc *in_RDI;
  FuncState *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  
  luaK_dischargevars(in_RSI,(expdesc *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8)
                    );
  freeexp(in_RSI,(expdesc *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  luaK_reserveregs(in_RSI,in_stack_ffffffffffffffec);
  exp2reg(unaff_retaddr,in_RDI,(int)((ulong)in_RSI >> 0x20));
  return;
}

Assistant:

static void luaK_exp2nextreg(FuncState*fs,expdesc*e){
luaK_dischargevars(fs,e);
freeexp(fs,e);
luaK_reserveregs(fs,1);
exp2reg(fs,e,fs->freereg-1);
}